

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O0

int gmlc::utilities::stringOps::trailingStringInt(string_view input,int defNum)

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  size_type sVar4;
  int in_EDX;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  basic_string_view<char,_std::char_traits<char>_> sub;
  basic_string_view<char,_std::char_traits<char>_> sub_1;
  size_t length;
  int num;
  size_type pos1;
  size_type in_stack_fffffffffffffec8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffed0;
  basic_string_view<char,_std::char_traits<char>_> *this;
  size_t in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  basic_string_view<char,_std::char_traits<char>_> local_88 [2];
  basic_string_view<char,_std::char_traits<char>_> local_68;
  size_type local_58;
  int local_3c;
  undefined8 local_38;
  char *local_30;
  size_type local_28;
  int local_1c;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_1c = in_EDX;
  bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  if (!bVar1) {
    pvVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::back(&local_18);
    iVar2 = isdigit((int)*pvVar3);
    if (iVar2 != 0) {
      local_38 = 10;
      local_30 = "0123456789";
      bVar5._M_str = in_stack_fffffffffffffee0;
      bVar5._M_len = in_stack_fffffffffffffed8;
      local_28 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                           (in_stack_fffffffffffffed0,bVar5,in_stack_fffffffffffffec8);
      local_3c = 0;
      if (local_28 == 0xffffffffffffffff) {
        sVar4 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::length(&local_18);
        if (sVar4 < 0xb) {
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
          CLI::std::from_chars<int>
                    (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                     (int *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
          return local_3c;
        }
        sVar4 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::length(&local_18);
        local_28 = sVar4 - 10;
      }
      local_58 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::length(&local_18);
      if (local_28 == local_58 - 2) {
        pvVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::back(&local_18);
        return *pvVar3 + -0x30;
      }
      if ((10 < local_58) && (local_28 < local_58 - 10)) {
        bVar5 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                          (in_stack_fffffffffffffef0,
                           CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                           (size_type)in_stack_fffffffffffffee0);
        this = local_88;
        local_88[0] = bVar5;
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::data(this);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::data(this);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(this);
        CLI::std::from_chars<int>
                  ((char *)bVar5._M_len,bVar5._M_str,(int *)in_stack_fffffffffffffef0,
                   in_stack_fffffffffffffeec);
        return local_3c;
      }
      local_68 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (in_stack_fffffffffffffef0,
                            CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                            (size_type)in_stack_fffffffffffffee0);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::data(&local_68);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::data(&local_68);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(&local_68);
      CLI::std::from_chars<int>
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                 (int *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
      return local_3c;
    }
  }
  return local_1c;
}

Assistant:

int trailingStringInt(std::string_view input, int defNum) noexcept
    {
        if ((input.empty()) || (isdigit(input.back()) == 0)) {
            return defNum;
        }

        auto pos1 = input.find_last_not_of(digits);
        int num{0};
        if (pos1 == std::string::npos)  // in case the whole thing is a number
        {
            if (input.length() <= 10) {
                std::from_chars(input.data(), input.data() + input.size(), num);
                return num;
            }
            pos1 = input.length() - 10;
        }

        size_t length = input.length();
        if (pos1 == length - 2) {
            return input.back() - '0';
        }
        if ((length <= 10) || (pos1 >= length - 10)) {
            auto sub = input.substr(pos1 + 1);

            std::from_chars(sub.data(), sub.data() + sub.size(), num);
            return num;
        }
        auto sub = input.substr(length - 9);

        std::from_chars(sub.data(), sub.data() + sub.size(), num);
        return num;
    }